

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoGeneric.cpp
# Opt level: O2

void __thiscall
chrono::ChConstraintTwoGeneric::Build_Cq
          (ChConstraintTwoGeneric *this,ChSparseMatrix *storage,int insrow)

{
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_60;
  
  if (((this->super_ChConstraintTwo).variables_a)->disabled == false) {
    Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
    Ref<Eigen::Matrix<double,1,_1,1,1,_1>>
              ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_60,
               (DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)&this->Cq_a,(type *)0x0);
    PasteMatrix(storage,&local_60,insrow,((this->super_ChConstraintTwo).variables_a)->offset,true);
    Eigen::internal::handmade_aligned_free
              (local_60.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_data);
  }
  if (((this->super_ChConstraintTwo).variables_b)->disabled == false) {
    Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
    Ref<Eigen::Matrix<double,1,_1,1,1,_1>>
              ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_60,
               (DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)&this->Cq_b,(type *)0x0);
    PasteMatrix(storage,&local_60,insrow,((this->super_ChConstraintTwo).variables_b)->offset,true);
    Eigen::internal::handmade_aligned_free
              (local_60.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_data);
  }
  return;
}

Assistant:

void ChConstraintTwoGeneric::Build_Cq(ChSparseMatrix& storage, int insrow) {
    if (variables_a->IsActive())
        PasteMatrix(storage, Cq_a, insrow, variables_a->GetOffset());
    if (variables_b->IsActive())
        PasteMatrix(storage, Cq_b, insrow, variables_b->GetOffset());
}